

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsplitter.cpp
# Opt level: O0

int __thiscall QSplitter::qt_metacall(QSplitter *this,Call _c,int _id,void **_a)

{
  undefined8 *in_RCX;
  int in_ESI;
  QFrame *in_RDI;
  long in_FS_OFFSET;
  QObject *unaff_retaddr;
  void **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  Call in_stack_ffffffffffffffc4;
  int local_28;
  QMetaType in_stack_fffffffffffffff0;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = QFrame::qt_metacall(in_RDI,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                                 in_stack_ffffffffffffffb8);
  if (-1 < local_28) {
    if (in_ESI == 0) {
      if (local_28 < 1) {
        qt_static_metacall(unaff_retaddr,(Call)((ulong)lVar1 >> 0x20),(int)lVar1,
                           (void **)in_stack_fffffffffffffff0.d_ptr);
      }
      local_28 = local_28 + -1;
    }
    if (in_ESI == 7) {
      if (local_28 < 1) {
        memset(&stack0xfffffffffffffff0,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xfffffffffffffff0);
        *(QMetaTypeInterface **)*in_RCX = in_stack_fffffffffffffff0.d_ptr;
      }
      local_28 = local_28 + -1;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(unaff_retaddr,(Call)((ulong)lVar1 >> 0x20),(int)lVar1,
                         (void **)in_stack_fffffffffffffff0.d_ptr);
      local_28 = local_28 + -4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int QSplitter::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFrame::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}